

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock_test.cc
# Opt level: O0

void btree_reverse_iterator_test(void)

{
  btree_result bVar1;
  filemgr *blk_ops;
  btree_kv_ops *__ptr;
  int iVar2;
  filemgr_open_result fVar3;
  char *fname;
  uint64_t v;
  uint64_t k;
  uint64_t i;
  filemgr_open_result fr;
  btree_result br;
  btree_kv_ops *kv_ops;
  filemgr_config config;
  btree_iterator bi;
  btree btree;
  btreeblk_handle bhandle;
  filemgr *file;
  int nodesize;
  int c;
  int r;
  int vsize;
  int ksize;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  err_log_callback *in_stack_000003f0;
  char *in_stack_000003f8;
  undefined1 in_stack_00000407;
  filemgr *in_stack_00000408;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 uVar4;
  uint32_t in_stack_fffffffffffffdb4;
  filemgr *in_stack_fffffffffffffdb8;
  btreeblk_handle *handle;
  undefined4 in_stack_fffffffffffffdd4;
  char *kv_ops_00;
  btree_kv_ops *btree_00;
  ulong local_220;
  ulong local_218;
  uint8_t in_stack_fffffffffffffdf0;
  ulong uVar5;
  bnode_flag_t flag;
  filemgr *pfVar6;
  btree_meta *meta;
  undefined4 local_1e8 [4];
  undefined1 local_1d8;
  undefined2 local_1c8;
  btree local_120 [3];
  filemgr *local_70;
  undefined4 local_64;
  int local_60;
  int local_5c;
  undefined4 local_58;
  undefined4 local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_54 = 8;
  local_58 = 8;
  local_64 = 0x100;
  kv_ops_00 = "./btreeblock_testfile";
  local_5c = system("rm -rf  btreeblock_testfile");
  memleak_start();
  memset(local_1e8,0,0x60);
  local_1e8[0] = local_64;
  local_1d8 = 8;
  local_1c8 = 8;
  btree_00 = (btree_kv_ops *)kv_ops_00;
  get_filemgr_ops();
  fVar3 = filemgr_open((char *)bhandle.ndeltanodes,(filemgr_ops *)bhandle.nlivenodes,
                       (filemgr_config *)bhandle._0_8_,(err_log_callback *)btree.aux);
  blk_ops = fVar3.file;
  iVar2 = fVar3.rv;
  meta = (btree_meta *)CONCAT44(in_stack_fffffffffffffdd4,iVar2);
  pfVar6 = blk_ops;
  local_70 = blk_ops;
  btreeblk_init((btreeblk_handle *)kv_ops_00,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4);
  flag = (bnode_flag_t)pfVar6;
  __ptr = btree_kv_get_kb64_vb64
                    ((btree_kv_ops *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  btreeblk_get_ops();
  uVar4 = 0;
  handle = (btreeblk_handle *)0x0;
  btree_init((btree *)btree_00,(void *)CONCAT44(in_stack_fffffffffffffdd4,iVar2),
             (btree_blk_ops *)blk_ops,(btree_kv_ops *)kv_ops_00,0,'\0',in_stack_fffffffffffffdf0,
             flag,meta);
  for (uVar5 = 10; uVar5 < 0x28; uVar5 = uVar5 + 1) {
    local_218 = (uVar5 << 4) >> 0x38 | ((uVar5 & 0xff00000000000) << 4) >> 0x28 |
                ((uVar5 & 0xff000000000) << 4) >> 0x18 | ((uVar5 & 0xff0000000) << 4) >> 8 |
                (uVar5 & 0xff00000) << 0xc | (uVar5 & 0xff000) << 0x1c | (uVar5 & 0xff0) << 0x2c |
                uVar5 << 0x3c;
    local_220 = (uVar5 << 8) >> 0x38 | ((uVar5 & 0xff0000000000) << 8) >> 0x28 |
                ((uVar5 & 0xff00000000) << 8) >> 0x18 | uVar5 & 0xff000000 |
                (uVar5 & 0xff0000) << 0x10 | (uVar5 & 0xff00) << 0x20 | (uVar5 & 0xff) << 0x30;
    btree_insert(local_120,&local_218,&local_220);
    btreeblk_end(handle);
  }
  local_60 = 0;
  btree_iterator_init((btree *)kv_ops_00,(btree_iterator *)handle,
                      (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
  do {
    bVar1 = btree_next((btree_iterator *)kv_ops_00,handle,
                       (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
    if (bVar1 != BTREE_RESULT_SUCCESS) {
      btreeblk_end(handle);
      btree_iterator_free((btree_iterator *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
      if (local_60 != 0x1e) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                ,0x27e);
        btree_reverse_iterator_test::__test_pass = 0;
        if (local_60 != 0x1e) {
          __assert_fail("c == 30",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                        ,0x27e,"void btree_reverse_iterator_test()");
        }
      }
      local_60 = 0;
      local_218 = 0x1027000000000000;
      btree_iterator_init((btree *)kv_ops_00,(btree_iterator *)handle,
                          (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
      while (bVar1 = btree_next((btree_iterator *)kv_ops_00,handle,
                                (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4)),
            bVar1 == BTREE_RESULT_SUCCESS) {
        btreeblk_end(handle);
        local_218 = local_218 >> 0x38 | (local_218 & 0xff000000000000) >> 0x28 |
                    (local_218 & 0xff0000000000) >> 0x18 | (local_218 & 0xff00000000) >> 8 |
                    (local_218 & 0xff000000) << 8 | (local_218 & 0xff0000) << 0x18 |
                    (local_218 & 0xff00) << 0x28 | local_218 << 0x38;
        local_220 = local_220 >> 0x38 | (local_220 & 0xff000000000000) >> 0x28 |
                    (local_220 & 0xff0000000000) >> 0x18 | (local_220 & 0xff00000000) >> 8 |
                    (local_220 & 0xff000000) << 8 | (local_220 & 0xff0000) << 0x18 |
                    (local_220 & 0xff00) << 0x28 | local_220 << 0x38;
      }
      btreeblk_end(handle);
      btree_iterator_free((btree_iterator *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
      if (local_60 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                ,0x28b);
        btree_reverse_iterator_test::__test_pass = 0;
        if (local_60 != 0) {
          __assert_fail("c == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                        ,0x28b,"void btree_reverse_iterator_test()");
        }
      }
      local_60 = 0;
      btree_iterator_init((btree *)kv_ops_00,(btree_iterator *)handle,
                          (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
      while (bVar1 = btree_prev((btree_iterator *)kv_ops_00,handle,
                                (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4)),
            bVar1 == BTREE_RESULT_SUCCESS) {
        btreeblk_end(handle);
        local_218 = local_218 >> 0x38 | (local_218 & 0xff000000000000) >> 0x28 |
                    (local_218 & 0xff0000000000) >> 0x18 | (local_218 & 0xff00000000) >> 8 |
                    (local_218 & 0xff000000) << 8 | (local_218 & 0xff0000) << 0x18 |
                    (local_218 & 0xff00) << 0x28 | local_218 << 0x38;
        local_220 = local_220 >> 0x38 | (local_220 & 0xff000000000000) >> 0x28 |
                    (local_220 & 0xff0000000000) >> 0x18 | (local_220 & 0xff00000000) >> 8 |
                    (local_220 & 0xff000000) << 8 | (local_220 & 0xff0000) << 0x18 |
                    (local_220 & 0xff00) << 0x28 | local_220 << 0x38;
      }
      btreeblk_end(handle);
      btree_iterator_free((btree_iterator *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
      if (local_60 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                ,0x297);
        btree_reverse_iterator_test::__test_pass = 0;
        if (local_60 != 0) {
          __assert_fail("c == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                        ,0x297,"void btree_reverse_iterator_test()");
        }
      }
      local_60 = 0;
      local_218 = 0x1027000000000000;
      btree_iterator_init((btree *)kv_ops_00,(btree_iterator *)handle,
                          (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
      do {
        bVar1 = btree_prev((btree_iterator *)kv_ops_00,handle,
                           (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
        if (bVar1 != BTREE_RESULT_SUCCESS) {
          btreeblk_end(handle);
          btree_iterator_free((btree_iterator *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
          if (local_60 != 0x1e) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x2a7);
            btree_reverse_iterator_test::__test_pass = 0;
            if (local_60 != 0x1e) {
              __assert_fail("c == 30",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                            ,0x2a7,"void btree_reverse_iterator_test()");
            }
          }
          local_60 = 0;
          local_218 = 0x7501000000000000;
          btree_iterator_init((btree *)kv_ops_00,(btree_iterator *)handle,
                              (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
          do {
            bVar1 = btree_prev((btree_iterator *)kv_ops_00,handle,
                               (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
            if (bVar1 != BTREE_RESULT_SUCCESS) {
              btreeblk_end(handle);
              btree_iterator_free((btree_iterator *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
              if (local_60 != 0xe) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                        ,0x2b7);
                btree_reverse_iterator_test::__test_pass = 0;
                if (local_60 != 0xe) {
                  __assert_fail("c == 14",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                ,0x2b7,"void btree_reverse_iterator_test()");
                }
              }
              local_60 = 0x90;
              btree_iterator_init((btree *)kv_ops_00,(btree_iterator *)handle,
                                  (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
              uVar5 = 0;
              do {
                if (0xe < uVar5) {
                  uVar5 = 0;
                  do {
                    if (6 < uVar5) {
                      uVar5 = 0;
                      do {
                        if (9 < uVar5) {
                          uVar5 = 0;
                          do {
                            if (0x10 < uVar5) {
                              bVar1 = btree_prev((btree_iterator *)kv_ops_00,handle,
                                                 (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
                              btreeblk_end(handle);
                              if (bVar1 != BTREE_RESULT_FAIL) {
                                fprintf(_stderr,"Test failed: %s %d\n",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                        ,0x2e5);
                                btree_reverse_iterator_test::__test_pass = 0;
                                if (bVar1 != BTREE_RESULT_FAIL) {
                                  __assert_fail("br == BTREE_RESULT_FAIL",
                                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                                ,0x2e5,"void btree_reverse_iterator_test()");
                                }
                              }
                              btree_iterator_free((btree_iterator *)
                                                  CONCAT44(in_stack_fffffffffffffdb4,uVar4));
                              free(__ptr);
                              btreeblk_free((btreeblk_handle *)kv_ops_00);
                              filemgr_close(in_stack_00000408,(bool)in_stack_00000407,
                                            in_stack_000003f8,in_stack_000003f0);
                              filemgr_shutdown();
                              memleak_end();
                              if (btree_reverse_iterator_test::__test_pass == 0) {
                                fprintf(_stderr,"%s FAILED\n","btree reverse iterator test");
                              }
                              else {
                                fprintf(_stderr,"%s PASSED\n","btree reverse iterator test");
                              }
                              return;
                            }
                            local_60 = local_60 + -0x10;
                            bVar1 = btree_prev((btree_iterator *)kv_ops_00,handle,
                                               (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
                            if (bVar1 != BTREE_RESULT_SUCCESS) {
                              fprintf(_stderr,"Test failed: %s %d\n",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                      ,0x2dc);
                              btree_reverse_iterator_test::__test_pass = 0;
                              if (bVar1 != BTREE_RESULT_SUCCESS) {
                                __assert_fail("br == BTREE_RESULT_SUCCESS",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                              ,0x2dc,"void btree_reverse_iterator_test()");
                              }
                            }
                            btreeblk_end(handle);
                            local_218 = local_218 >> 0x38 | (local_218 & 0xff000000000000) >> 0x28 |
                                        (local_218 & 0xff0000000000) >> 0x18 |
                                        (local_218 & 0xff00000000) >> 8 |
                                        (local_218 & 0xff000000) << 8 |
                                        (local_218 & 0xff0000) << 0x18 |
                                        (local_218 & 0xff00) << 0x28 | local_218 << 0x38;
                            local_220 = local_220 >> 0x38 | (local_220 & 0xff000000000000) >> 0x28 |
                                        (local_220 & 0xff0000000000) >> 0x18 |
                                        (local_220 & 0xff00000000) >> 8 |
                                        (local_220 & 0xff000000) << 8 |
                                        (local_220 & 0xff0000) << 0x18 |
                                        (local_220 & 0xff00) << 0x28 | local_220 << 0x38;
                            if (local_218 != (long)local_60) {
                              fprintf(_stderr,"Test failed: %s %d\n",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                      ,0x2e0);
                              btree_reverse_iterator_test::__test_pass = 0;
                              if (local_218 != (long)local_60) {
                                __assert_fail("k == (uint64_t)c",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                              ,0x2e0,"void btree_reverse_iterator_test()");
                              }
                            }
                            if (local_220 != (long)local_60 * 0x10) {
                              fprintf(_stderr,"Test failed: %s %d\n",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                      ,0x2e1);
                              btree_reverse_iterator_test::__test_pass = 0;
                              if (local_220 != (long)local_60 * 0x10) {
                                __assert_fail("v == (uint64_t)c*0x10",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                              ,0x2e1,"void btree_reverse_iterator_test()");
                              }
                            }
                            uVar5 = uVar5 + 1;
                          } while( true );
                        }
                        local_60 = local_60 + 0x10;
                        bVar1 = btree_next((btree_iterator *)kv_ops_00,handle,
                                           (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
                        if (bVar1 != BTREE_RESULT_SUCCESS) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                  ,0x2d2);
                          btree_reverse_iterator_test::__test_pass = 0;
                          if (bVar1 != BTREE_RESULT_SUCCESS) {
                            __assert_fail("br == BTREE_RESULT_SUCCESS",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                          ,0x2d2,"void btree_reverse_iterator_test()");
                          }
                        }
                        btreeblk_end(handle);
                        local_218 = local_218 >> 0x38 | (local_218 & 0xff000000000000) >> 0x28 |
                                    (local_218 & 0xff0000000000) >> 0x18 |
                                    (local_218 & 0xff00000000) >> 8 | (local_218 & 0xff000000) << 8
                                    | (local_218 & 0xff0000) << 0x18 | (local_218 & 0xff00) << 0x28
                                    | local_218 << 0x38;
                        local_220 = local_220 >> 0x38 | (local_220 & 0xff000000000000) >> 0x28 |
                                    (local_220 & 0xff0000000000) >> 0x18 |
                                    (local_220 & 0xff00000000) >> 8 | (local_220 & 0xff000000) << 8
                                    | (local_220 & 0xff0000) << 0x18 | (local_220 & 0xff00) << 0x28
                                    | local_220 << 0x38;
                        if (local_218 != (long)local_60) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                  ,0x2d6);
                          btree_reverse_iterator_test::__test_pass = 0;
                          if (local_218 != (long)local_60) {
                            __assert_fail("k == (uint64_t)c",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                          ,0x2d6,"void btree_reverse_iterator_test()");
                          }
                        }
                        if (local_220 != (long)local_60 * 0x10) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                  ,0x2d7);
                          btree_reverse_iterator_test::__test_pass = 0;
                          if (local_220 != (long)local_60 * 0x10) {
                            __assert_fail("v == (uint64_t)c*0x10",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                          ,0x2d7,"void btree_reverse_iterator_test()");
                          }
                        }
                        uVar5 = uVar5 + 1;
                      } while( true );
                    }
                    local_60 = local_60 + -0x10;
                    bVar1 = btree_prev((btree_iterator *)kv_ops_00,handle,
                                       (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
                    if (bVar1 != BTREE_RESULT_SUCCESS) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                              ,0x2c8);
                      btree_reverse_iterator_test::__test_pass = 0;
                      if (bVar1 != BTREE_RESULT_SUCCESS) {
                        __assert_fail("br == BTREE_RESULT_SUCCESS",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                      ,0x2c8,"void btree_reverse_iterator_test()");
                      }
                    }
                    btreeblk_end(handle);
                    local_218 = local_218 >> 0x38 | (local_218 & 0xff000000000000) >> 0x28 |
                                (local_218 & 0xff0000000000) >> 0x18 |
                                (local_218 & 0xff00000000) >> 8 | (local_218 & 0xff000000) << 8 |
                                (local_218 & 0xff0000) << 0x18 | (local_218 & 0xff00) << 0x28 |
                                local_218 << 0x38;
                    local_220 = local_220 >> 0x38 | (local_220 & 0xff000000000000) >> 0x28 |
                                (local_220 & 0xff0000000000) >> 0x18 |
                                (local_220 & 0xff00000000) >> 8 | (local_220 & 0xff000000) << 8 |
                                (local_220 & 0xff0000) << 0x18 | (local_220 & 0xff00) << 0x28 |
                                local_220 << 0x38;
                    if (local_218 != (long)local_60) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                              ,0x2cc);
                      btree_reverse_iterator_test::__test_pass = 0;
                      if (local_218 != (long)local_60) {
                        __assert_fail("k == (uint64_t)c",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                      ,0x2cc,"void btree_reverse_iterator_test()");
                      }
                    }
                    if (local_220 != (long)local_60 * 0x10) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                              ,0x2cd);
                      btree_reverse_iterator_test::__test_pass = 0;
                      if (local_220 != (long)local_60 * 0x10) {
                        __assert_fail("v == (uint64_t)c*0x10",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                      ,0x2cd,"void btree_reverse_iterator_test()");
                      }
                    }
                    uVar5 = uVar5 + 1;
                  } while( true );
                }
                local_60 = local_60 + 0x10;
                bVar1 = btree_next((btree_iterator *)kv_ops_00,handle,
                                   (void *)CONCAT44(in_stack_fffffffffffffdb4,uVar4));
                if (bVar1 != BTREE_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2be);
                  btree_reverse_iterator_test::__test_pass = 0;
                  if (bVar1 != BTREE_RESULT_SUCCESS) {
                    __assert_fail("br == BTREE_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                  ,0x2be,"void btree_reverse_iterator_test()");
                  }
                }
                btreeblk_end(handle);
                local_218 = local_218 >> 0x38 | (local_218 & 0xff000000000000) >> 0x28 |
                            (local_218 & 0xff0000000000) >> 0x18 | (local_218 & 0xff00000000) >> 8 |
                            (local_218 & 0xff000000) << 8 | (local_218 & 0xff0000) << 0x18 |
                            (local_218 & 0xff00) << 0x28 | local_218 << 0x38;
                local_220 = local_220 >> 0x38 | (local_220 & 0xff000000000000) >> 0x28 |
                            (local_220 & 0xff0000000000) >> 0x18 | (local_220 & 0xff00000000) >> 8 |
                            (local_220 & 0xff000000) << 8 | (local_220 & 0xff0000) << 0x18 |
                            (local_220 & 0xff00) << 0x28 | local_220 << 0x38;
                if (local_218 != (long)local_60) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2c2);
                  btree_reverse_iterator_test::__test_pass = 0;
                  if (local_218 != (long)local_60) {
                    __assert_fail("k == (uint64_t)c",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                  ,0x2c2,"void btree_reverse_iterator_test()");
                  }
                }
                if (local_220 != (long)local_60 * 0x10) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2c3);
                  btree_reverse_iterator_test::__test_pass = 0;
                  if (local_220 != (long)local_60 * 0x10) {
                    __assert_fail("v == (uint64_t)c*0x10",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                  ,0x2c3,"void btree_reverse_iterator_test()");
                  }
                }
                uVar5 = uVar5 + 1;
              } while( true );
            }
            btreeblk_end(handle);
            local_218 = local_218 >> 0x38 | (local_218 & 0xff000000000000) >> 0x28 |
                        (local_218 & 0xff0000000000) >> 0x18 | (local_218 & 0xff00000000) >> 8 |
                        (local_218 & 0xff000000) << 8 | (local_218 & 0xff0000) << 0x18 |
                        (local_218 & 0xff00) << 0x28 | local_218 << 0x38;
            local_220 = local_220 >> 0x38 | (local_220 & 0xff000000000000) >> 0x28 |
                        (local_220 & 0xff0000000000) >> 0x18 | (local_220 & 0xff00000000) >> 8 |
                        (local_220 & 0xff000000) << 8 | (local_220 & 0xff0000) << 0x18 |
                        (local_220 & 0xff00) << 0x28 | local_220 << 0x38;
            if (local_218 != (long)(0x17 - local_60) * 0x10) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                      ,0x2b1);
              btree_reverse_iterator_test::__test_pass = 0;
              if (local_218 != (long)(0x17 - local_60) * 0x10) {
                __assert_fail("k == (uint64_t)(0x17-c)*0x10",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                              ,0x2b1,"void btree_reverse_iterator_test()");
              }
            }
            if (local_220 != (long)(0x17 - local_60) * 0x100) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                      ,0x2b2);
              btree_reverse_iterator_test::__test_pass = 0;
              if (local_220 != (long)(0x17 - local_60) * 0x100) {
                __assert_fail("v == (uint64_t)(0x17-c)*0x100",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                              ,0x2b2,"void btree_reverse_iterator_test()");
              }
            }
            local_60 = local_60 + 1;
          } while( true );
        }
        btreeblk_end(handle);
        local_218 = local_218 >> 0x38 | (local_218 & 0xff000000000000) >> 0x28 |
                    (local_218 & 0xff0000000000) >> 0x18 | (local_218 & 0xff00000000) >> 8 |
                    (local_218 & 0xff000000) << 8 | (local_218 & 0xff0000) << 0x18 |
                    (local_218 & 0xff00) << 0x28 | local_218 << 0x38;
        local_220 = local_220 >> 0x38 | (local_220 & 0xff000000000000) >> 0x28 |
                    (local_220 & 0xff0000000000) >> 0x18 | (local_220 & 0xff00000000) >> 8 |
                    (local_220 & 0xff000000) << 8 | (local_220 & 0xff0000) << 0x18 |
                    (local_220 & 0xff00) << 0x28 | local_220 << 0x38;
        if (local_218 != (long)(0x27 - local_60) * 0x10) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                  ,0x2a1);
          btree_reverse_iterator_test::__test_pass = 0;
          if (local_218 != (long)(0x27 - local_60) * 0x10) {
            __assert_fail("k == (uint64_t)(39-c)*0x10",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2a1,"void btree_reverse_iterator_test()");
          }
        }
        if (local_220 != (long)(0x27 - local_60) * 0x100) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                  ,0x2a2);
          btree_reverse_iterator_test::__test_pass = 0;
          if (local_220 != (long)(0x27 - local_60) * 0x100) {
            __assert_fail("v == (uint64_t)(39-c)*0x100",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2a2,"void btree_reverse_iterator_test()");
          }
        }
        local_60 = local_60 + 1;
      } while( true );
    }
    btreeblk_end(handle);
    local_218 = local_218 >> 0x38 | (local_218 & 0xff000000000000) >> 0x28 |
                (local_218 & 0xff0000000000) >> 0x18 | (local_218 & 0xff00000000) >> 8 |
                (local_218 & 0xff000000) << 8 | (local_218 & 0xff0000) << 0x18 |
                (local_218 & 0xff00) << 0x28 | local_218 << 0x38;
    local_220 = local_220 >> 0x38 | (local_220 & 0xff000000000000) >> 0x28 |
                (local_220 & 0xff0000000000) >> 0x18 | (local_220 & 0xff00000000) >> 8 |
                (local_220 & 0xff000000) << 8 | (local_220 & 0xff0000) << 0x18 |
                (local_220 & 0xff00) << 0x28 | local_220 << 0x38;
    if (local_218 != (long)(local_60 + 10) * 0x10) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
              ,0x278);
      btree_reverse_iterator_test::__test_pass = 0;
      if (local_218 != (long)(local_60 + 10) * 0x10) {
        __assert_fail("k == (uint64_t)(c+10)*0x10",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                      ,0x278,"void btree_reverse_iterator_test()");
      }
    }
    if (local_220 != (long)(local_60 + 10) * 0x100) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
              ,0x279);
      btree_reverse_iterator_test::__test_pass = 0;
      if (local_220 != (long)(local_60 + 10) * 0x100) {
        __assert_fail("v == (uint64_t)(c+10)*0x100",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                      ,0x279,"void btree_reverse_iterator_test()");
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

void btree_reverse_iterator_test()
{
    TEST_INIT();

    int ksize = 8, vsize = 8, r, c;
    int nodesize = 256;
    struct filemgr *file;
    struct btreeblk_handle bhandle;
    struct btree btree;
    struct btree_iterator bi;
    struct filemgr_config config;
    struct btree_kv_ops *kv_ops;
    btree_result br;
    filemgr_open_result fr;
    uint64_t i;
    uint64_t k,v;
    char *fname = (char *) "./btreeblock_testfile";

    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;

    memleak_start();

    memset(&config, 0, sizeof(config));
    config.blocksize = nodesize;
    config.options = FILEMGR_CREATE;
    config.num_wal_shards = 8;
    fr = filemgr_open(fname, get_filemgr_ops(), &config, NULL);
    file = fr.file;

    btreeblk_init(&bhandle, file, nodesize);
    kv_ops = btree_kv_get_kb64_vb64(NULL);
    btree_init(&btree, (void*)&bhandle,
               btreeblk_get_ops(), kv_ops,
               nodesize, ksize, vsize, 0x0, NULL);

    for (i=10;i<40;++i) {
        k = _endian_encode(i*0x10);
        v = _endian_encode(i*0x100);
        btree_insert(&btree, (void*)&k, (void*)&v);
        btreeblk_end(&bhandle);
    }

    c = 0;
    btree_iterator_init(&btree, &bi, NULL);
    while ((br=btree_next(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)(c+10)*0x10);
        TEST_CHK(v == (uint64_t)(c+10)*0x100);
        c++;
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 30);

    c = 0;
    i=10000;
    k = _endian_encode(i);
    btree_iterator_init(&btree, &bi, &k);
    while ((br=btree_next(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 0);

    // reverse iteration with NULL initial key
    c = 0;
    btree_iterator_init(&btree, &bi, NULL);
    while ((br=btree_prev(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 0);

    c = 0;
    i=10000;
    k = _endian_encode(i);
    btree_iterator_init(&btree, &bi, &k);
    while ((br=btree_prev(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)(39-c)*0x10);
        TEST_CHK(v == (uint64_t)(39-c)*0x100);
        c++;
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 30);

    c = 0;
    i=0x175;
    k = _endian_encode(i);
    btree_iterator_init(&btree, &bi, &k);
    while ((br=btree_prev(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)(0x17-c)*0x10);
        TEST_CHK(v == (uint64_t)(0x17-c)*0x100);
        c++;
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 14);

    c = 0xa0 - 0x10;
    btree_iterator_init(&btree, &bi, NULL);
    for (i=0;i<15;++i){
        c += 0x10;
        br = btree_next(&bi, &k, &v);
        TEST_CHK(br == BTREE_RESULT_SUCCESS);
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)c);
        TEST_CHK(v == (uint64_t)c*0x10);
    }
    for (i=0;i<7;++i){
        c -= 0x10;
        br = btree_prev(&bi, &k, &v);
        TEST_CHK(br == BTREE_RESULT_SUCCESS);
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)c);
        TEST_CHK(v == (uint64_t)c*0x10);
    }
    for (i=0;i<10;++i){
        c += 0x10;
        br = btree_next(&bi, &k, &v);
        TEST_CHK(br == BTREE_RESULT_SUCCESS);
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)c);
        TEST_CHK(v == (uint64_t)c*0x10);
    }
    for (i=0;i<17;++i){
        c -= 0x10;
        br = btree_prev(&bi, &k, &v);
        TEST_CHK(br == BTREE_RESULT_SUCCESS);
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)c);
        TEST_CHK(v == (uint64_t)c*0x10);
    }
    br = btree_prev(&bi, &k, &v);
    btreeblk_end(&bhandle);
    TEST_CHK(br == BTREE_RESULT_FAIL);

    btree_iterator_free(&bi);

    free(kv_ops);
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    memleak_end();

    TEST_RESULT("btree reverse iterator test");
}